

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O2

bool __thiscall cmCPackIFWRepository::IsValid(cmCPackIFWRepository *this)

{
  size_type sVar1;
  
  if (this->Update < Replace) {
    sVar1 = (this->Url)._M_string_length;
  }
  else {
    if (this->Update != Replace) {
      return true;
    }
    if ((this->OldUrl)._M_string_length == 0) {
      return false;
    }
    sVar1 = (this->NewUrl)._M_string_length;
  }
  return sVar1 != 0;
}

Assistant:

bool cmCPackIFWRepository::IsValid() const
{
  bool valid = true;

  switch (this->Update) {
    case cmCPackIFWRepository::None:
    case cmCPackIFWRepository::Add:
    case cmCPackIFWRepository::Remove:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Replace:
      valid = !this->OldUrl.empty() && !this->NewUrl.empty();
      break;
  }

  return valid;
}